

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  byte *pbVar14;
  long in_FS_OFFSET;
  
  puVar4 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                    ,0x6e1,
                    "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                   );
    }
    puVar4 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar4 == (uchar *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
      puVar4 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar6 = req_comp + img_n * 8;
        if ((0x23 < uVar6) || ((0xe161a1c00U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                        ,0x6fe,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        uVar5 = 1;
        if (1 < (int)y) {
          uVar5 = (ulong)y;
        }
        iVar1 = x - 1;
        uVar13 = 0;
        uVar11 = 0;
        uVar12 = 0;
        do {
          iVar8 = (int)uVar12 * x;
          pbVar14 = data + (uint)(iVar8 * img_n);
          pbVar9 = puVar4 + (uint)(iVar8 * req_comp);
          if (uVar6 - 10 < 0x19) {
            switch(uVar6) {
            case 10:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar7 = x;
                do {
                  puVar4[lVar10 * 2 + uVar11] = data[lVar10 + uVar13];
                  puVar4[lVar10 * 2 + uVar11 + 1] = 0xff;
                  uVar7 = uVar7 - 1;
                  lVar10 = lVar10 + 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                pbVar9 = puVar4 + uVar11 + 2;
                uVar7 = x;
                do {
                  bVar2 = *pbVar14;
                  *pbVar9 = bVar2;
                  pbVar9[-1] = bVar2;
                  pbVar9[-2] = bVar2;
                  pbVar14 = pbVar14 + 1;
                  uVar7 = uVar7 - 1;
                  pbVar9 = pbVar9 + 3;
                } while (0 < (int)uVar7);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar7 = x;
                do {
                  uVar3 = data[lVar10 + uVar13];
                  puVar4[lVar10 * 4 + uVar11 + 2] = uVar3;
                  puVar4[lVar10 * 4 + uVar11 + 1] = uVar3;
                  puVar4[lVar10 * 4 + uVar11] = uVar3;
                  puVar4[lVar10 * 4 + uVar11 + 3] = 0xff;
                  uVar7 = uVar7 - 1;
                  lVar10 = lVar10 + 1;
                } while (0 < (int)uVar7);
              }
              break;
            default:
              goto switchD_001b0e3c_caseD_d;
            case 0x11:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar7 = x;
                do {
                  puVar4[lVar10 + uVar11] = data[lVar10 * 2 + uVar13];
                  uVar7 = uVar7 - 1;
                  lVar10 = lVar10 + 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                pbVar9 = puVar4 + uVar11 + 2;
                uVar7 = x;
                do {
                  bVar2 = *pbVar14;
                  *pbVar9 = bVar2;
                  pbVar9[-1] = bVar2;
                  pbVar9[-2] = bVar2;
                  pbVar14 = pbVar14 + 2;
                  uVar7 = uVar7 - 1;
                  pbVar9 = pbVar9 + 3;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar7 = x;
                do {
                  uVar3 = data[lVar10 + uVar13];
                  puVar4[lVar10 * 2 + uVar11 + 2] = uVar3;
                  puVar4[lVar10 * 2 + uVar11 + 1] = uVar3;
                  puVar4[lVar10 * 2 + uVar11] = uVar3;
                  puVar4[lVar10 * 2 + uVar11 + 3] = data[lVar10 + uVar13 + 1];
                  uVar7 = uVar7 - 1;
                  lVar10 = lVar10 + 2;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x19:
              uVar7 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar14[2];
                  *pbVar9 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar14[1] * 0x96 + (uint)*pbVar14 * 0x4d >> 8);
                  pbVar14 = pbVar14 + 3;
                  pbVar9 = pbVar9 + 1;
                  uVar7 = uVar7 - 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x1a:
              uVar7 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar14[2];
                  *pbVar9 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar14[1] * 0x96 + (uint)*pbVar14 * 0x4d >> 8);
                  pbVar9[1] = 0xff;
                  pbVar14 = pbVar14 + 3;
                  pbVar9 = pbVar9 + 2;
                  uVar7 = uVar7 - 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x1c:
              uVar7 = x;
              if (-1 < iVar1) {
                do {
                  *pbVar9 = *pbVar14;
                  pbVar9[1] = pbVar14[1];
                  pbVar9[2] = pbVar14[2];
                  pbVar9[3] = 0xff;
                  pbVar14 = pbVar14 + 3;
                  pbVar9 = pbVar9 + 4;
                  uVar7 = uVar7 - 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar7 = x;
                do {
                  bVar2 = data[lVar10 * 4 + uVar13 + 2];
                  puVar4[lVar10 + uVar11] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar10 * 4 + uVar13 + 1] * 0x96 +
                               (uint)data[lVar10 * 4 + uVar13] * 0x4d >> 8);
                  uVar7 = uVar7 - 1;
                  lVar10 = lVar10 + 1;
                } while (0 < (int)uVar7);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar7 = x;
                do {
                  bVar2 = data[lVar10 * 2 + uVar13 + 2];
                  puVar4[lVar10 + uVar11] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar10 * 2 + uVar13 + 1] * 0x96 +
                               (uint)data[lVar10 * 2 + uVar13] * 0x4d >> 8);
                  puVar4[lVar10 + uVar11 + 1] = data[lVar10 * 2 + uVar13 + 3];
                  uVar7 = uVar7 - 1;
                  lVar10 = lVar10 + 2;
                } while (0 < (int)uVar7);
              }
            }
          }
          else {
switchD_001b0e3c_caseD_d:
            uVar7 = x;
            if (-1 < iVar1) {
              do {
                *pbVar9 = *pbVar14;
                pbVar9[1] = pbVar14[1];
                pbVar9[2] = pbVar14[2];
                pbVar14 = pbVar14 + 4;
                pbVar9 = pbVar9 + 3;
                uVar7 = uVar7 - 1;
              } while (0 < (int)uVar7);
            }
          }
          uVar12 = uVar12 + 1;
          uVar11 = (ulong)((int)uVar11 + x * req_comp);
          uVar13 = (ulong)((int)uVar13 + x * img_n);
        } while (uVar12 != uVar5);
      }
      free(data);
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}